

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O1

DependencyInfo *
duckdb::DependencyInfo::FromDependent(DependencyInfo *__return_storage_ptr__,DependencyEntry *dep)

{
  pointer pcVar1;
  DependencyDependent *pDVar2;
  DependencySubject *pDVar3;
  
  pDVar2 = DependencyEntry::Dependent(dep);
  (__return_storage_ptr__->dependent).entry.type = (pDVar2->entry).type;
  (__return_storage_ptr__->dependent).entry.schema._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->dependent).entry.schema.field_2;
  pcVar1 = (pDVar2->entry).schema._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->dependent).entry.schema,pcVar1,
             pcVar1 + (pDVar2->entry).schema._M_string_length);
  (__return_storage_ptr__->dependent).entry.name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->dependent).entry.name.field_2;
  pcVar1 = (pDVar2->entry).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->dependent).entry.name,pcVar1,
             pcVar1 + (pDVar2->entry).name._M_string_length);
  (__return_storage_ptr__->dependent).flags.super_DependencyFlags._vptr_DependencyFlags =
       (_func_int **)&PTR__DependencyFlags_02478188;
  (__return_storage_ptr__->dependent).flags.super_DependencyFlags.value =
       (pDVar2->flags).super_DependencyFlags.value;
  (__return_storage_ptr__->dependent).flags.super_DependencyFlags._vptr_DependencyFlags =
       (_func_int **)&PTR__DependencyFlags_024781b0;
  pDVar3 = DependencyEntry::Subject(dep);
  (__return_storage_ptr__->subject).entry.type = (pDVar3->entry).type;
  (__return_storage_ptr__->subject).entry.schema._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->subject).entry.schema.field_2;
  pcVar1 = (pDVar3->entry).schema._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->subject).entry.schema,pcVar1,
             pcVar1 + (pDVar3->entry).schema._M_string_length);
  (__return_storage_ptr__->subject).entry.name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->subject).entry.name.field_2;
  pcVar1 = (pDVar3->entry).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->subject).entry.name,pcVar1,
             pcVar1 + (pDVar3->entry).name._M_string_length);
  (__return_storage_ptr__->subject).flags.super_DependencyFlags._vptr_DependencyFlags =
       (_func_int **)&PTR__DependencyFlags_02478188;
  (__return_storage_ptr__->subject).flags.super_DependencyFlags.value =
       (pDVar3->flags).super_DependencyFlags.value;
  (__return_storage_ptr__->subject).flags.super_DependencyFlags._vptr_DependencyFlags =
       (_func_int **)&PTR__DependencyFlags_02478138;
  return __return_storage_ptr__;
}

Assistant:

DependencyInfo DependencyInfo::FromDependent(DependencyEntry &dep) {
	return DependencyInfo {/*dependent = */ dep.Dependent(),
	                       /*subject = */ dep.Subject()};
}